

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double uniform_01_sample(int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double temp;
  int loxa;
  int leftlo;
  int k;
  int ixhi;
  int iprhi;
  int *seed_local;
  
  if (*seed == 0) {
    *seed = uniform_01_sample::ip;
  }
  iVar1 = (*seed - (*seed / uniform_01_sample::ib16) * uniform_01_sample::ib16) *
          uniform_01_sample::ia;
  iVar2 = iVar1 / uniform_01_sample::ib16;
  iVar3 = (*seed / uniform_01_sample::ib16) * uniform_01_sample::ia + iVar2;
  iVar4 = iVar3 / uniform_01_sample::ib15;
  *seed = ((iVar1 - iVar2 * uniform_01_sample::ib16) - uniform_01_sample::ip) +
          (iVar3 - iVar4 * uniform_01_sample::ib15) * uniform_01_sample::ib16 + iVar4;
  if (*seed < 0) {
    *seed = *seed + uniform_01_sample::ip;
  }
  return (double)*seed * 4.656612875e-10;
}

Assistant:

double uniform_01_sample ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_01_SAMPLE is a random number generator.
//
//  Discussion:
//
//    SEED = SEED * (7^5) mod (2^31 - 1)
//    UNIFORM_01_SAMPLE = SEED * / ( 2^31 - 1 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, int &SEED, the integer "seed" used to generate
//    the output random number, and updated in preparation for the
//    next one.  SEED should not be zero.
//
//    Output, double UNIFORM_01_SAMPLE, a random value between 0 and 1.
//
//  Local Parameters:
//
//    Local, int IA = 7^5.
//
//    Local, int IB = 2^15.
//
//    Local, int IB16 = 2^16.
//
//    Local, int IP = 2^31 - 1.
//
{
  static int ia = 16807;
  static int ib15 = 32768;
  static int ib16 = 65536;
  static int ip = 2147483647;
  int iprhi;
  int ixhi;
  int k;
  int leftlo;
  int loxa;
  double temp;
//
//  Don't let SEED be 0.
//
  if ( seed == 0 )
  {
    seed = ip;
  }
//
//  Get the 15 high order bits of SEED.
//
  ixhi = seed / ib16;
//
//  Get the 16 low bits of SEED and form the low product.
//
  loxa = ( seed - ixhi * ib16 ) * ia;
//
//  Get the 15 high order bits of the low product.
//
  leftlo = loxa / ib16;
//
//  Form the 31 highest bits of the full product.
//
  iprhi = ixhi * ia + leftlo;
//
//  Get overflow past the 31st bit of full product.
//
  k = iprhi / ib15;
//
//  Assemble all the parts and presubtract IP.  The parentheses are essential.
//
  seed = ( ( ( loxa - leftlo * ib16 ) - ip ) +
    ( iprhi - k * ib15 ) * ib16 ) + k;
//
//  Add IP back in if necessary.
//
  if ( seed < 0 )
  {
    seed = seed + ip;
  }
//
//  Multiply by 1 / (2^31-1).
//
  temp = static_cast< double > ( seed) * 4.656612875E-10;

  return temp;
}